

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

SmallVector<spirv_cross::SpecializationConstant,_8UL> * __thiscall
spirv_cross::Compiler::get_specialization_constants
          (SmallVector<spirv_cross::SpecializationConstant,_8UL> *__return_storage_ptr__,
          Compiler *this)

{
  anon_class_16_2_ecf838a1 local_30;
  undefined1 local_19;
  Compiler *local_18;
  Compiler *this_local;
  SmallVector<spirv_cross::SpecializationConstant,_8UL> *spec_consts;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Compiler *)__return_storage_ptr__;
  SmallVector<spirv_cross::SpecializationConstant,_8UL>::SmallVector(__return_storage_ptr__);
  local_30.this = this;
  local_30.spec_consts = __return_storage_ptr__;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRConstant,spirv_cross::Compiler::get_specialization_constants()const::__0>
            (&this->ir,&local_30);
  return __return_storage_ptr__;
}

Assistant:

SmallVector<SpecializationConstant> Compiler::get_specialization_constants() const
{
	SmallVector<SpecializationConstant> spec_consts;
	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, const SPIRConstant &c) {
		if (c.specialization && has_decoration(c.self, DecorationSpecId))
			spec_consts.push_back({ c.self, get_decoration(c.self, DecorationSpecId) });
	});
	return spec_consts;
}